

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BringWindowToFront(ImGuiWindow *window)

{
  int iVar1;
  ImGuiWindow **ppIVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  long lVar5;
  ImGuiWindow **ppIVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  
  pIVar4 = GImGui;
  iVar9 = (GImGui->Windows).Size;
  lVar5 = (long)iVar9;
  if (lVar5 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                  ,0x4ca,"value_type &ImVector<ImGuiWindow *>::back() [T = ImGuiWindow *]");
  }
  ppIVar2 = (GImGui->Windows).Data;
  if (((ppIVar2[lVar5 + -1] != window) && (ppIVar2[lVar5 + -1]->RootWindow != window)) &&
     (iVar9 != 1)) {
    uVar8 = iVar9 - 2;
    do {
      if (ppIVar2[uVar8] == window) {
        ppIVar6 = (GImGui->Windows).Data + uVar8;
        if ((ppIVar2 <= ppIVar6) && (ppIVar6 < ppIVar2 + lVar5)) {
          memmove(ppIVar6,ppIVar6 + 1,(((ulong)~((long)ppIVar6 - (long)ppIVar2) >> 3) + lVar5) * 8);
          iVar9 = (pIVar4->Windows).Size;
          iVar1 = (pIVar4->Windows).Capacity;
          (pIVar4->Windows).Size = iVar9 + -1;
          if (iVar9 + -1 == iVar1) {
            if (iVar1 == 0) {
              iVar7 = 8;
            }
            else {
              iVar7 = iVar1 / 2 + iVar1;
            }
            if (iVar9 < iVar7) {
              iVar9 = iVar7;
            }
            if (iVar1 < iVar9) {
              GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
              ppIVar6 = (ImGuiWindow **)
                        (*GImAllocatorAllocFunc)((long)iVar9 << 3,GImAllocatorUserData);
              ppIVar2 = (pIVar4->Windows).Data;
              if (ppIVar2 != (ImGuiWindow **)0x0) {
                memcpy(ppIVar6,ppIVar2,(long)(pIVar4->Windows).Size << 3);
                ppIVar2 = (pIVar4->Windows).Data;
                if (ppIVar2 != (ImGuiWindow **)0x0) {
                  GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
                }
                (*GImAllocatorFreeFunc)(ppIVar2,GImAllocatorUserData);
              }
              (pIVar4->Windows).Data = ppIVar6;
              (pIVar4->Windows).Capacity = iVar9;
            }
          }
          (pIVar4->Windows).Data[(pIVar4->Windows).Size] = window;
          (pIVar4->Windows).Size = (pIVar4->Windows).Size + 1;
          return;
        }
        __assert_fail("it >= Data && it < Data+Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                      ,0x4e3,
                      "iterator ImVector<ImGuiWindow *>::erase(const_iterator) [T = ImGuiWindow *]")
        ;
      }
      bVar3 = 0 < (int)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void ImGui::BringWindowToFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* current_front_window = g.Windows.back();
    if (current_front_window == window || current_front_window->RootWindow == window)
        return;
    for (int i = g.Windows.Size - 2; i >= 0; i--) // We can ignore the front most window
        if (g.Windows[i] == window)
        {
            g.Windows.erase(g.Windows.Data + i);
            g.Windows.push_back(window);
            break;
        }
}